

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

int sf::Texture::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  int extraout_EAX;
  undefined4 in_register_0000003c;
  float local_68 [2];
  GLfloat matrix [16];
  TransientContextLock local_15;
  int local_14;
  TransientContextLock lock;
  long lStack_10;
  CoordinateType coordinateType_local;
  Texture *texture_local;
  
  lStack_10 = CONCAT44(in_register_0000003c,__fd);
  local_14 = (int)__addr;
  GlResource::TransientContextLock::TransientContextLock(&local_15);
  if ((lStack_10 == 0) || (*(int *)(lStack_10 + 0x10) == 0)) {
    glBindTexture(0xde1,0);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x30e,"glBindTexture(GL_TEXTURE_2D, 0)");
    glMatrixMode(0x1702);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x311,"glMatrixMode(GL_TEXTURE)");
    glLoadIdentity();
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x312,"glLoadIdentity()");
    glMatrixMode(0x1700);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x315,"glMatrixMode(GL_MODELVIEW)");
  }
  else {
    glBindTexture(0xde1,*(undefined4 *)(lStack_10 + 0x10));
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x2ea,"glBindTexture(GL_TEXTURE_2D, texture->m_texture)");
    if ((local_14 == 1) || ((*(byte *)(lStack_10 + 0x17) & 1) != 0)) {
      memset(local_68,0,0x40);
      local_68[0] = 1.0;
      matrix[3] = 1.0;
      matrix[8] = 1.0;
      matrix[0xd] = 1.0;
      if (local_14 == 1) {
        local_68[0] = 1.0 / (float)*(uint *)(lStack_10 + 8);
        matrix[3] = 1.0 / (float)*(uint *)(lStack_10 + 0xc);
      }
      if ((*(byte *)(lStack_10 + 0x17) & 1) != 0) {
        matrix[3] = -matrix[3];
        matrix[0xb] = (float)*(uint *)(lStack_10 + 4) / (float)*(uint *)(lStack_10 + 0xc);
      }
      glMatrixMode(0x1702);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x304,"glMatrixMode(GL_TEXTURE)");
      glLoadMatrixf(local_68);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x305,"glLoadMatrixf(matrix)");
      glMatrixMode(0x1700);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x308,"glMatrixMode(GL_MODELVIEW)");
    }
  }
  GlResource::TransientContextLock::~TransientContextLock(&local_15);
  return extraout_EAX;
}

Assistant:

void Texture::bind(const Texture* texture, CoordinateType coordinateType)
{
    TransientContextLock lock;

    if (texture && texture->m_texture)
    {
        // Bind the texture
        glCheck(glBindTexture(GL_TEXTURE_2D, texture->m_texture));

        // Check if we need to define a special texture matrix
        if ((coordinateType == Pixels) || texture->m_pixelsFlipped)
        {
            GLfloat matrix[16] = {1.f, 0.f, 0.f, 0.f,
                                  0.f, 1.f, 0.f, 0.f,
                                  0.f, 0.f, 1.f, 0.f,
                                  0.f, 0.f, 0.f, 1.f};

            // If non-normalized coordinates (= pixels) are requested, we need to
            // setup scale factors that convert the range [0 .. size] to [0 .. 1]
            if (coordinateType == Pixels)
            {
                matrix[0] = 1.f / texture->m_actualSize.x;
                matrix[5] = 1.f / texture->m_actualSize.y;
            }

            // If pixels are flipped we must invert the Y axis
            if (texture->m_pixelsFlipped)
            {
                matrix[5] = -matrix[5];
                matrix[13] = static_cast<float>(texture->m_size.y) / texture->m_actualSize.y;
            }

            // Load the matrix
            glCheck(glMatrixMode(GL_TEXTURE));
            glCheck(glLoadMatrixf(matrix));

            // Go back to model-view mode (sf::RenderTarget relies on it)
            glCheck(glMatrixMode(GL_MODELVIEW));
        }
    }
    else
    {
        // Bind no texture
        glCheck(glBindTexture(GL_TEXTURE_2D, 0));

        // Reset the texture matrix
        glCheck(glMatrixMode(GL_TEXTURE));
        glCheck(glLoadIdentity());

        // Go back to model-view mode (sf::RenderTarget relies on it)
        glCheck(glMatrixMode(GL_MODELVIEW));
    }
}